

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwapChainGLBase.hpp
# Opt level: O1

bool __thiscall
Diligent::SwapChainGLBase<Diligent::ISwapChainGL>::Resize
          (SwapChainGLBase<Diligent::ISwapChainGL> *this,Uint32 NewWidth,Uint32 NewHeight,
          SURFACE_TRANSFORM NewPreTransform,Int32 param_4)

{
  TextureImplType *pTexture;
  bool bVar1;
  bool bVar2;
  DeviceContextGLImpl *this_00;
  RenderDeviceGLImpl *pRenderDeviceGL;
  undefined4 in_register_0000000c;
  char (*Args_1) [167];
  RefCntAutoPtr<Diligent::IDeviceContext> pDeviceContext;
  string _msg;
  undefined1 local_48 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  Args_1 = (char (*) [167])CONCAT44(in_register_0000000c,NewPreTransform);
  if (SURFACE_TRANSFORM_IDENTITY < NewPreTransform) {
    local_48._0_8_ = GetSurfaceTransformString(NewPreTransform);
    FormatString<char_const*,char[167]>
              ((string *)(local_48 + 8),(Diligent *)local_48,
               (char **)
               " is not an allowed pretransform because OpenGL swap chains only support identity transform. Use SURFACE_TRANSFORM_OPTIMAL (recommended) or SURFACE_TRANSFORM_IDENTITY."
               ,Args_1);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(1,local_48._8_8_,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._8_8_ != &local_30) {
      operator_delete((void *)local_48._8_8_,local_30._M_allocated_capacity + 1);
    }
  }
  bVar1 = SwapChainBase<Diligent::ISwapChainGL>::Resize
                    (&this->super_SwapChainBase<Diligent::ISwapChainGL>,NewWidth,NewHeight,
                     SURFACE_TRANSFORM_OPTIMAL,0);
  if (bVar1) {
    if ((this->m_pRenderTargetView).m_pObject != (TextureViewGLImpl *)0x0) {
      RefCntWeakPtr<Diligent::IDeviceContext>::Lock
                ((RefCntWeakPtr<Diligent::IDeviceContext> *)local_48);
      if ((RefCountersImpl *)local_48._0_8_ != (RefCountersImpl *)0x0) {
        this_00 = RefCntAutoPtr<Diligent::IDeviceContext>::RawPtr<Diligent::DeviceContextGLImpl>
                            ((RefCntAutoPtr<Diligent::IDeviceContext> *)local_48);
        pTexture = (TextureImplType *)
                   (((this->m_pRenderTargetView).m_pObject)->
                   super_TextureViewBase<Diligent::EngineGLImplTraits>).m_pTexture;
        if (pTexture != (TextureImplType *)0x0) {
          CheckDynamicType<Diligent::TextureBaseGL,Diligent::ITexture>((ITexture *)pTexture);
        }
        bVar2 = DeviceContextBase<Diligent::EngineGLImplTraits>::UnbindTextureFromFramebuffer
                          (&this_00->super_DeviceContextBase<Diligent::EngineGLImplTraits>,pTexture,
                           false);
        if ((bVar2) && (Resize::IsFirstTime == true)) {
          FormatString<char[165]>
                    ((string *)(local_48 + 8),
                     (char (*) [165])
                     "Resizing the swap chain requires back and depth-stencil buffers to be unbound from the device context. An application should use SetRenderTargets() to restore them."
                    );
          if (DebugMessageCallback != (undefined *)0x0) {
            (*(code *)DebugMessageCallback)(0,local_48._8_8_,0,0,0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._8_8_ != &local_30) {
            operator_delete((void *)local_48._8_8_,local_30._M_allocated_capacity + 1);
          }
          Resize::IsFirstTime = false;
        }
      }
      if ((RefCountersImpl *)local_48._0_8_ != (RefCountersImpl *)0x0) {
        (*((IObject *)local_48._0_8_)->_vptr_IObject[2])();
        local_48._0_8_ = (RefCountersImpl *)0x0;
      }
    }
    pRenderDeviceGL =
         RefCntAutoPtr<Diligent::IRenderDevice>::RawPtr<Diligent::RenderDeviceGLImpl>
                   (&(this->super_SwapChainBase<Diligent::ISwapChainGL>).m_pRenderDevice);
    CreateDummyBuffers(this,pRenderDeviceGL);
  }
  return bVar1;
}

Assistant:

bool Resize(Uint32 NewWidth, Uint32 NewHeight, SURFACE_TRANSFORM NewPreTransform, Int32 /*To be different from virtual function*/)
    {
        if (NewPreTransform != SURFACE_TRANSFORM_OPTIMAL &&
            NewPreTransform != SURFACE_TRANSFORM_IDENTITY)
        {
            LOG_WARNING_MESSAGE(GetSurfaceTransformString(NewPreTransform),
                                " is not an allowed pretransform because OpenGL swap chains only support identity transform. "
                                "Use SURFACE_TRANSFORM_OPTIMAL (recommended) or SURFACE_TRANSFORM_IDENTITY.");
        }
        NewPreTransform = SURFACE_TRANSFORM_OPTIMAL;

        if (TSwapChainBase::Resize(NewWidth, NewHeight, NewPreTransform))
        {
            if (m_pRenderTargetView)
            {
                if (auto pDeviceContext = this->m_wpDeviceContext.Lock())
                {
                    auto* pImmediateCtxGL = pDeviceContext.template RawPtr<DeviceContextGLImpl>();
                    // Unbind the back buffer to be consistent with other backends
                    auto* pCurrentBackBuffer = ClassPtrCast<TextureBaseGL>(m_pRenderTargetView->GetTexture());
                    auto  RenderTargetsReset = pImmediateCtxGL->UnbindTextureFromFramebuffer(pCurrentBackBuffer, false);
                    if (RenderTargetsReset)
                    {
                        LOG_INFO_MESSAGE_ONCE("Resizing the swap chain requires back and depth-stencil buffers to be unbound from the device context. "
                                              "An application should use SetRenderTargets() to restore them.");
                    }
                }
            }

            CreateDummyBuffers(this->m_pRenderDevice.template RawPtr<RenderDeviceGLImpl>());
            return true;
        }

        return false;
    }